

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

void __thiscall gvr::PLYWriter::writeHeader(PLYWriter *this)

{
  ofstream *poVar1;
  ply_encoding pVar2;
  PLYElement *pPVar3;
  pointer ppPVar4;
  char cVar5;
  pointer ppPVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  pointer pPVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  string local_50;
  
  if (this->header_complete != false) {
    return;
  }
  poVar1 = &this->out;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ply",3);
  cVar5 = (char)poVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"format ",7);
  pVar2 = this->enc;
  if (pVar2 == ply_little_endian) {
    pcVar11 = "binary_little_endian ";
    lVar8 = 0x15;
  }
  else if (pVar2 == ply_big_endian) {
    pcVar11 = "binary_big_endian ";
    lVar8 = 0x12;
  }
  else {
    if (pVar2 != ply_ascii) goto LAB_0010fa03;
    pcVar11 = "ascii ";
    lVar8 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar11,lVar8);
LAB_0010fa03:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"1.0",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->out + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  ppPVar6 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppPVar6) {
    uVar10 = 0;
    do {
      pPVar3 = ppPVar6[uVar10];
      this->element = pPVar3;
      PLYElement::toString_abi_cxx11_(&local_50,pPVar3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((0 < this->element->size) &&
         (pPVar12 = (this->element->list).
                    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         0 < (int)((ulong)((long)(this->element->list).
                                 super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar12) >> 6)))
      {
        lVar8 = 0;
        lVar15 = 0;
        do {
          (anonymous_namespace)::PLYProperty::toString_abi_cxx11_
                    (&local_50,(PLYProperty *)((long)&pPVar12->enc + lVar8));
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,local_50._M_dataplus._M_p,local_50._M_string_length)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          lVar15 = lVar15 + 1;
          pPVar12 = (this->element->list).
                    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 0x40;
        } while (lVar15 < (int)((ulong)((long)(this->element->list).
                                              super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pPVar12) >> 6));
      }
      uVar10 = uVar10 + 1;
      ppPVar6 = (this->list).
                super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->list).
                                    super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar6 >> 3)
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"end_header",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  ppPVar6 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppPVar4 = (this->list).super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  this->header_complete = true;
  this->element = (PLYElement *)0x0;
  lVar8 = (long)ppPVar4 - (long)ppPVar6;
  bVar16 = lVar8 != 0;
  if (lVar8 == 0) {
    uVar10 = 0;
  }
  else {
    uVar13 = lVar8 >> 3;
    uVar14 = uVar13 + (uVar13 == 0);
    uVar9 = 0;
    do {
      pPVar3 = ppPVar6[uVar9];
      if ((0 < pPVar3->size) &&
         (uVar10 = uVar9,
         (int)((ulong)((long)*(pointer *)
                              ((long)&(pPVar3->list).
                                      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                      ._M_impl + 8) -
                      *(long *)&(pPVar3->list).
                                super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                ._M_impl.super__Vector_impl_data) >> 6) != 0)) break;
      uVar9 = uVar9 + 1;
      bVar16 = uVar9 < uVar13;
      uVar10 = uVar14;
    } while (uVar14 != uVar9);
  }
  this->pelem = uVar10;
  this->pinst = 1;
  this->pprop = 1;
  this->plist = 0;
  if (bVar16) {
    pPVar3 = ppPVar6[uVar10];
    this->element = pPVar3;
    this->pinst = pPVar3->size;
    this->pprop = (int)((ulong)((long)(pPVar3->list).
                                      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pPVar3->list).
                                     super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6) + 1;
  }
  return;
}

Assistant:

void PLYWriter::writeHeader()
{
  if (!header_complete)
  {
    // write magic code

    out << "ply" << std::endl;

    // write encoding and version

    out << "format ";

    switch (enc)
    {
      case ply_ascii:
        out << "ascii ";
        break;

      case ply_big_endian:
        out << "binary_big_endian ";
        break;

      case ply_little_endian:
        out << "binary_little_endian ";
        break;

      default:
        break;
    }

    out << "1.0" << std::endl;

    // write all comments and elements

    for (size_t i=0; i<list.size(); i++)
    {
      element=list[i];

      out << element->toString() << std::endl;

      if (element->getInstances() > 0)
      {
        // write properties

        for (int k=0; k<element->getPropertyCount(); k++)
        {
          out << element->getProperty(k).toString() << std::endl;
        }
      }
    }

    out << "end_header" << "\n";

    header_complete=true;

    // set element pointer to first element with one or more properties and
    // one or more instances

    element=0;

    pelem=0;

    while (pelem < list.size() && (list[pelem]->getInstances() <= 0 ||
                                   list[pelem]->getPropertyCount() == 0))
    {
      pelem++;
    }

    pinst=1;
    pprop=1;
    plist=0;

    if (pelem < list.size())
    {
      element=list[pelem];
      pinst=element->getInstances();
      pprop=element->getPropertyCount()+1;
    }
  }
}